

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O0

void __thiscall cmCoreTryCompile::CleanupFiles(cmCoreTryCompile *this,string *binDir)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  string *psVar6;
  long lVar7;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  string local_218;
  cmAlphaNum local_1f8;
  cmAlphaNum local_1c8;
  string local_198;
  Status local_178;
  Status status;
  string local_160 [32];
  undefined1 local_140 [8];
  string fullPath;
  allocator<char> local_109;
  value_type local_108;
  _Base_ptr local_e8;
  undefined1 local_e0;
  string_view local_d8;
  string_view local_c8;
  char *local_b8;
  char *fileName;
  unsigned_long i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deletedFiles;
  Directory local_70;
  Directory dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *binDir_local;
  cmCoreTryCompile *this_local;
  
  local_18 = binDir;
  binDir_local = &this->BinaryDirectory;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    bVar1 = IsTemporary(local_18);
    if (bVar1) {
      cmsys::Directory::Directory(&local_70);
      deletedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)cmsys::Directory::Load(&local_70,local_18,(string *)0x0);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i);
      for (fileName = (char *)0x0; pcVar5 = fileName,
          pcVar4 = (char *)cmsys::Directory::GetNumberOfFiles(&local_70), pcVar5 < pcVar4;
          fileName = fileName + 1) {
        local_b8 = cmsys::Directory::GetFile(&local_70,(unsigned_long)fileName);
        iVar2 = strcmp(local_b8,".");
        if ((iVar2 != 0) && (iVar2 = strcmp(local_b8,".."), iVar2 != 0)) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_c8,local_b8);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d8,".nfs")
          ;
          bVar1 = cmHasPrefix(local_c8,local_d8);
          pcVar5 = local_b8;
          if (!bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_108,pcVar5,&local_109);
            pVar8 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&i,&local_108);
            fullPath.field_2._8_8_ = pVar8.first._M_node;
            local_e0 = pVar8.second;
            local_e8 = (_Base_ptr)fullPath.field_2._8_8_;
            std::__cxx11::string::~string((string *)&local_108);
            std::allocator<char>::~allocator(&local_109);
            if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              std::__cxx11::string::string(local_160,(string *)local_18);
              pcVar5 = (char *)std::__cxx11::string::append((char *)local_160);
              psVar6 = (string *)std::__cxx11::string::append(pcVar5);
              std::__cxx11::string::string((string *)local_140,psVar6);
              std::__cxx11::string::~string(local_160);
              bVar1 = cmsys::SystemTools::FileIsSymlink((string *)local_140);
              if (bVar1) {
                cmsys::SystemTools::RemoveFile((string *)local_140);
              }
              else {
                bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_140);
                if (bVar1) {
                  CleanupFiles(this,(string *)local_140);
                  status = cmsys::SystemTools::RemoveADirectory((string *)local_140);
                }
                else {
                  local_178 = cmsys::SystemTools::RemoveFile((string *)local_140);
                  bVar1 = cmsys::Status::operator_cast_to_bool(&local_178);
                  if (!bVar1) {
                    this_00 = this->Makefile;
                    cmAlphaNum::cmAlphaNum(&local_1c8,"The file:\n  ");
                    cmAlphaNum::cmAlphaNum(&local_1f8,(string *)local_140);
                    cmsys::Status::GetString_abi_cxx11_(&local_218,&local_178);
                    cmStrCat<char[26],std::__cxx11::string>
                              (&local_198,&local_1c8,&local_1f8,
                               (char (*) [26])"\ncould not be removed:\n  ",&local_218);
                    cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_198);
                    std::__cxx11::string::~string((string *)&local_198);
                    std::__cxx11::string::~string((string *)&local_218);
                  }
                }
              }
              std::__cxx11::string::~string((string *)local_140);
            }
          }
        }
      }
      lVar7 = std::__cxx11::string::find((char *)local_18,0xdb736b);
      if (lVar7 != -1) {
        cmsys::SystemTools::RemoveADirectory(local_18);
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i);
      cmsys::Directory::~Directory(&local_70);
    }
    else {
      std::operator+(&local_58,
                     "TRY_COMPILE attempt to remove -rf directory that does not contain CMakeTmp or CMakeScratch: \""
                     ,local_18);
      std::operator+(&local_38,&local_58,"\"");
      cmSystemTools::Error(&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  return;
}

Assistant:

void cmCoreTryCompile::CleanupFiles(std::string const& binDir)
{
  if (binDir.empty()) {
    return;
  }

  if (!IsTemporary(binDir)) {
    cmSystemTools::Error(
      "TRY_COMPILE attempt to remove -rf directory that does not contain "
      "CMakeTmp or CMakeScratch: \"" +
      binDir + "\"");
    return;
  }

  cmsys::Directory dir;
  dir.Load(binDir);
  std::set<std::string> deletedFiles;
  for (unsigned long i = 0; i < dir.GetNumberOfFiles(); ++i) {
    const char* fileName = dir.GetFile(i);
    if (strcmp(fileName, ".") != 0 && strcmp(fileName, "..") != 0 &&
        // Do not delete NFS temporary files.
        !cmHasPrefix(fileName, ".nfs")) {
      if (deletedFiles.insert(fileName).second) {
        std::string const fullPath =
          std::string(binDir).append("/").append(fileName);
        if (cmSystemTools::FileIsSymlink(fullPath)) {
          cmSystemTools::RemoveFile(fullPath);
        } else if (cmSystemTools::FileIsDirectory(fullPath)) {
          this->CleanupFiles(fullPath);
          cmSystemTools::RemoveADirectory(fullPath);
        } else {
#ifdef _WIN32
          // Sometimes anti-virus software hangs on to new files so we
          // cannot delete them immediately.  Try a few times.
          cmSystemTools::WindowsFileRetry retry =
            cmSystemTools::GetWindowsFileRetry();
          cmsys::Status status;
          while (!((status = cmSystemTools::RemoveFile(fullPath))) &&
                 --retry.Count && cmSystemTools::FileExists(fullPath)) {
            cmSystemTools::Delay(retry.Delay);
          }
          if (retry.Count == 0)
#else
          cmsys::Status status = cmSystemTools::RemoveFile(fullPath);
          if (!status)
#endif
          {
            this->Makefile->IssueMessage(
              MessageType::FATAL_ERROR,
              cmStrCat("The file:\n  ", fullPath,
                       "\ncould not be removed:\n  ", status.GetString()));
          }
        }
      }
    }
  }

  if (binDir.find("CMakeScratch") != std::string::npos) {
    cmSystemTools::RemoveADirectory(binDir);
  }
}